

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackGenerator::InstallProjectViaInstallScript
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  pointer pcVar1;
  cmCPackLog *pcVar2;
  pointer pcVar3;
  char cVar4;
  long *plVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  pointer pbVar11;
  undefined7 in_register_00000031;
  string dir;
  string installScript;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeScriptsVector;
  ostringstream cmCPackLog_msg;
  char *local_238;
  long local_230;
  char local_228;
  undefined7 uStack_227;
  string *local_218;
  long *local_210;
  long local_208;
  long local_200 [2];
  long *local_1f0;
  long local_1e0 [2];
  undefined4 local_1cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1cc = (undefined4)CONCAT71(in_register_00000031,setDestDir);
  pcVar1 = local_1a8 + 0x10;
  local_218 = tempInstallDirectory;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_INSTALL_SCRIPT","");
  pcVar8 = GetOption(this,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"- Install scripts: ",0x13);
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,sVar9);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar2 = this->Logger;
    std::__cxx11::stringbuf::str();
    plVar5 = local_210;
    sVar9 = strlen((char *)local_210);
    cmCPackLog::Log(pcVar2,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x1e1,(char *)plVar5,sVar9);
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8._0_8_ = pcVar1;
    sVar9 = strlen(pcVar8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar8,pcVar8 + sVar9);
    cmSystemTools::ExpandListArgument((string *)local_1a8,&local_1c8,false);
    pbVar11 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      pbVar11 = local_1c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; pbVar11 !=
           local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
      local_210 = local_200;
      pcVar3 = (pbVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar3,pcVar3 + pbVar11->_M_string_length);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"- Install script: ",0x12);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)local_210,local_208);
      std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      pcVar2 = this->Logger;
      std::__cxx11::stringbuf::str();
      pcVar8 = local_238;
      sVar9 = strlen(local_238);
      cmCPackLog::Log(pcVar2,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x1ed,pcVar8,sVar9);
      if (local_238 != &local_228) {
        operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      cVar4 = (char)(string *)local_1a8;
      if ((char)local_1cc == '\0') {
        local_1a8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_INSTALL_PREFIX","");
        SetOption(this,(string *)local_1a8,(local_218->_M_dataplus)._M_p);
        if ((pointer)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"- Using non-DESTDIR install... (this->SetOption)",0x30);
        std::ios::widen((char)*(undefined8 *)(local_1a8._0_8_ + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        pcVar8 = local_238;
        sVar9 = strlen(local_238);
        cmCPackLog::Log(pcVar2,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x207,pcVar8,sVar9);
        if (local_238 != &local_228) {
          operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"- Setting CMAKE_INSTALL_PREFIX to \'",0x23);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(local_218->_M_dataplus)._M_p,
                             local_218->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        pcVar8 = local_238;
        sVar9 = strlen(local_238);
        cmCPackLog::Log(pcVar2,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x20a,pcVar8,sVar9);
        if (local_238 != &local_228) {
          operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        local_238 = &local_228;
        local_230 = 0;
        local_228 = '\0';
        local_1a8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CPACK_INSTALL_PREFIX","");
        pcVar8 = GetOption(this,(string *)local_1a8);
        if ((pointer)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (pcVar8 != (char *)0x0) {
          local_1a8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"CPACK_INSTALL_PREFIX","");
          GetOption(this,(string *)local_1a8);
          std::__cxx11::string::append((char *)&local_238);
          if ((pointer)local_1a8._0_8_ != pcVar1) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
        }
        local_1a8._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_INSTALL_PREFIX","");
        SetOption(this,(string *)local_1a8,local_238);
        if ((pointer)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "- Using DESTDIR + CPACK_INSTALL_PREFIX... (this->SetOption)",0x3b);
        std::ios::widen((char)*(undefined8 *)(local_1a8._0_8_ + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        plVar5 = local_1f0;
        sVar9 = strlen((char *)local_1f0);
        cmCPackLog::Log(pcVar2,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x1fe,(char *)plVar5,sVar9);
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"- Setting CMAKE_INSTALL_PREFIX to \'",0x23);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_238,local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pcVar2 = this->Logger;
        std::__cxx11::stringbuf::str();
        plVar5 = local_1f0;
        sVar9 = strlen((char *)local_1f0);
        cmCPackLog::Log(pcVar2,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x200,(char *)plVar5,sVar9);
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        if (local_238 != &local_228) {
          operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
        }
      }
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CMAKE_CURRENT_BINARY_DIR","");
      SetOptionIfNotSet(this,(string *)local_1a8,(local_218->_M_dataplus)._M_p);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CMAKE_CURRENT_SOURCE_DIR","");
      SetOptionIfNotSet(this,(string *)local_1a8,(local_218->_M_dataplus)._M_p);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      bVar6 = cmMakefile::ReadListFile(this->MakefileMap,(char *)local_210);
      bVar7 = true;
      if ((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false))
      {
        bVar7 = cmSystemTools::GetInterruptFlag();
      }
      if (local_210 != local_200) {
        operator_delete(local_210,local_200[0] + 1);
      }
      if ((bVar6 & (bVar7 ^ 1U)) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c8);
        return 0;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
  }
  return 1;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallScript(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  const char* cmakeScripts
    = this->GetOption("CPACK_INSTALL_SCRIPT");
  if ( cmakeScripts && *cmakeScripts )
    {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Install scripts: " << cmakeScripts << std::endl);
    std::vector<std::string> cmakeScriptsVector;
    cmSystemTools::ExpandListArgument(cmakeScripts,
      cmakeScriptsVector);
    std::vector<std::string>::iterator it;
    for ( it = cmakeScriptsVector.begin();
      it != cmakeScriptsVector.end();
      ++it )
      {
      std::string installScript = *it;

      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
        "- Install script: " << installScript << std::endl);

      if ( setDestDir )
        {
        // For DESTDIR based packaging, use the *project* CMAKE_INSTALL_PREFIX
        // underneath the tempInstallDirectory. The value of the project's
        // CMAKE_INSTALL_PREFIX is sent in here as the value of the
        // CPACK_INSTALL_PREFIX variable.

        std::string dir;
        if (this->GetOption("CPACK_INSTALL_PREFIX"))
          {
          dir += this->GetOption("CPACK_INSTALL_PREFIX");
          }
        this->SetOption("CMAKE_INSTALL_PREFIX", dir.c_str());
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Using DESTDIR + CPACK_INSTALL_PREFIX... (this->SetOption)"
          << std::endl);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Setting CMAKE_INSTALL_PREFIX to '" << dir << "'" << std::endl);
        }
      else
        {
        this->SetOption("CMAKE_INSTALL_PREFIX", tempInstallDirectory.c_str());

        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Using non-DESTDIR install... (this->SetOption)" << std::endl);
        cmCPackLogger(cmCPackLog::LOG_DEBUG,
          "- Setting CMAKE_INSTALL_PREFIX to '" << tempInstallDirectory
          << "'" << std::endl);
        }

      this->SetOptionIfNotSet("CMAKE_CURRENT_BINARY_DIR",
        tempInstallDirectory.c_str());
      this->SetOptionIfNotSet("CMAKE_CURRENT_SOURCE_DIR",
        tempInstallDirectory.c_str());
      int res = this->MakefileMap->ReadListFile(installScript.c_str());
      if ( cmSystemTools::GetErrorOccuredFlag() || !res )
        {
        return 0;
        }
      }
    }
  return 1;
}